

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Error ps_parser_load_field
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  FT_Byte FVar1;
  FT_Byte *pFVar2;
  FT_Byte *pFVar3;
  void *pvVar4;
  FT_Memory pFVar5;
  FT_Fixed *pFVar6;
  PS_Parser pPVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  FT_Int FVar11;
  FT_Pointer pvVar12;
  FT_Fixed FVar13;
  undefined4 in_register_0000000c;
  T1_FieldType TVar14;
  FT_Long power_ten;
  ulong uVar15;
  uint max_values;
  T1_Field pTVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  FT_Error local_d4;
  FT_Byte *cur;
  FT_Byte *local_c8;
  FT_Memory local_c0;
  T1_Field local_b8;
  ulong local_b0;
  PS_Parser local_a8;
  T1_TokenType local_a0;
  uint local_9c;
  void **local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  T1_TokenRec token2;
  FT_Fixed local_50;
  T1_TokenRec token;
  
  local_b0 = CONCAT44(in_register_0000000c,max_objects);
  local_a8 = parser;
  local_98 = objects;
  ps_parser_to_token(parser,&token);
  pPVar7 = local_a8;
  if (token.type == T1_TOKEN_TYPE_NONE) {
    return 3;
  }
  cur = token.start;
  TVar14 = field->type;
  local_a0 = token.type;
  local_b8 = field;
  if (TVar14 == T1_FIELD_TYPE_BBOX) {
    pFVar2 = local_a8->cursor;
    pFVar3 = local_a8->limit;
    local_a8->cursor = token.start + 1;
    local_c8 = token.limit;
    local_a8->limit = token.limit + -1;
    ps_parser_to_token(local_a8,&token2);
    pPVar7->cursor = pFVar2;
    pPVar7->limit = pFVar3;
    uVar15 = 1;
    if (token2.type != T1_TOKEN_TYPE_ARRAY) {
      local_9c = 0;
      TVar14 = T1_FIELD_TYPE_BBOX;
      goto LAB_001f1a95;
    }
    TVar14 = T1_FIELD_TYPE_MM_BBOX;
    iVar20 = (int)local_b0;
  }
  else {
    local_c8 = token.limit;
    if (token.type != T1_TOKEN_TYPE_ARRAY) {
      uVar15 = 1;
      local_9c = 0;
      goto LAB_001f1a95;
    }
    iVar20 = (int)local_b0;
    uVar15 = local_b0 & 0xffffffff;
  }
  if (iVar20 == 0) {
    return 3;
  }
  cur = token.start + 1;
  local_c8 = local_c8 + -1;
  local_9c = 1;
LAB_001f1a95:
  iVar20 = (int)local_b0;
  local_80 = (ulong)(uint)(iVar20 * 4);
  local_88 = (ulong)(uint)(iVar20 * 2);
  local_70 = (ulong)(uint)(iVar20 * 3);
  local_90 = local_b0 & 0xffffffff;
  local_78 = (ulong)(TVar14 - T1_FIELD_TYPE_BOOL);
  pTVar16 = local_b8;
  do {
    pFVar2 = local_c8;
    iVar20 = (int)uVar15;
    uVar15 = (ulong)(iVar20 - 1);
    if (iVar20 == 0) {
      return 0;
    }
    pvVar4 = local_98[local_9c];
    uVar19 = (ulong)pTVar16->offset;
    skip_spaces(&cur,local_c8);
    if (7 < (uint)local_78) {
      return 3;
    }
    switch((long)&switchD_001f1b12::switchdataD_002ae570 +
           (long)(int)(&switchD_001f1b12::switchdataD_002ae570)[local_78]) {
    case 0x1f1b14:
      if (cur < pFVar2) {
        pFVar5 = local_a8->memory;
        iVar20 = (int)local_c8 - (int)cur;
        if (local_a0 == T1_TOKEN_TYPE_STRING) {
          uVar10 = iVar20 - 2;
        }
        else {
          if (local_a0 != T1_TOKEN_TYPE_KEY) {
            return 3;
          }
          uVar10 = iVar20 - 1;
        }
        local_c0 = (FT_Memory)(cur + 1);
        cur = cur + 1;
        if (*(void **)((long)pvVar4 + uVar19) != (void *)0x0) {
          ft_mem_free(pFVar5,*(void **)((long)pvVar4 + uVar19));
          *(undefined8 *)((long)pvVar4 + uVar19) = 0;
        }
        pvVar12 = ft_mem_qalloc(pFVar5,(ulong)(uVar10 + 1),&local_d4);
        if (local_d4 != 0) {
          return local_d4;
        }
        memcpy(pvVar12,local_c0,(ulong)uVar10);
        *(undefined1 *)((long)pvVar12 + (ulong)uVar10) = 0;
        *(FT_Pointer *)((long)pvVar4 + uVar19) = pvVar12;
        pTVar16 = local_b8;
      }
      break;
    case 0x1f1b61:
      power_ten = 0;
      goto LAB_001f1c01;
    case 0x1f1b6e:
      pFVar5 = local_a8->memory;
      pvVar12 = ft_mem_qrealloc(pFVar5,8,0,local_80,(void *)0x0,&local_d4);
      uVar19 = local_b0;
      if (local_d4 != 0) {
        return local_d4;
      }
      uVar18 = 0;
      lVar17 = 4;
      local_c0 = pFVar5;
      while (uVar9 = local_88, uVar8 = local_90, bVar21 = lVar17 != 0, lVar17 = lVar17 + -1, bVar21)
      {
        max_values = (uint)uVar19;
        uVar10 = ps_tofixedarray(&cur,local_c8,max_values,(FT_Fixed *)((long)pvVar12 + uVar18 * 8),0
                                );
        if (((int)uVar10 < 0) || (uVar10 < max_values)) {
          local_d4 = 3;
          ft_mem_free(local_c0,pvVar12);
          return local_d4;
        }
        skip_spaces(&cur,local_c8);
        uVar18 = (ulong)((int)uVar18 + max_values);
      }
      for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
        pFVar6 = (FT_Fixed *)local_98[uVar19];
        FVar13 = FT_RoundFix(*(FT_Fixed *)((long)pvVar12 + uVar19 * 8));
        *pFVar6 = FVar13;
        iVar20 = (int)uVar19;
        FVar13 = FT_RoundFix(*(FT_Fixed *)((long)pvVar12 + (ulong)(uint)((int)uVar8 + iVar20) * 8));
        pFVar6[1] = FVar13;
        FVar13 = FT_RoundFix(*(FT_Fixed *)((long)pvVar12 + (ulong)(uint)((int)uVar9 + iVar20) * 8));
        pFVar6[2] = FVar13;
        FVar13 = FT_RoundFix(*(FT_Fixed *)
                              ((long)pvVar12 + (ulong)(uint)((int)local_70 + iVar20) * 8));
        pFVar6[3] = FVar13;
      }
      ft_mem_free(local_c0,pvVar12);
      pTVar16 = local_b8;
      break;
    case 0x1f1bf8:
      power_ten = 3;
LAB_001f1c01:
      FVar13 = PS_Conv_ToFixed(&cur,pFVar2,power_ten);
LAB_001f1cf6:
      FVar1 = pTVar16->size;
      if (FVar1 == '\x04') {
        *(int *)((long)pvVar4 + uVar19) = (int)FVar13;
      }
      else if (FVar1 == '\x02') {
        *(short *)((long)pvVar4 + uVar19) = (short)FVar13;
      }
      else if (FVar1 == '\x01') {
        *(char *)((long)pvVar4 + uVar19) = (char)FVar13;
      }
      else {
        *(FT_Fixed *)((long)pvVar4 + uVar19) = FVar13;
      }
      break;
    case 0x1f1c0b:
      pFVar3 = cur + 3;
      if ((((pFVar3 < pFVar2) && (*cur == 't')) && (cur[1] == 'r')) &&
         ((cur[2] == 'u' && (*pFVar3 == 'e')))) {
        cur = cur + 5;
        FVar13 = 1;
      }
      else {
        if ((((cur + 4 < pFVar2) && ((*cur == 'f' && (cur[1] == 'a')))) && (cur[2] == 'l')) &&
           ((*pFVar3 == 's' && (cur[4] == 'e')))) {
          cur = cur + 6;
        }
        FVar13 = 0;
      }
      goto LAB_001f1cf6;
    case 0x1f1c4f:
      FVar13 = PS_Conv_ToInt(&cur,pFVar2);
      goto LAB_001f1cf6;
    case 0x1f1c5f:
      FVar11 = ps_tofixedarray(&cur,pFVar2,4,(FT_Fixed *)&token2,0);
      if (FVar11 < 4) {
        return 3;
      }
      FVar13 = FT_RoundFix((FT_Fixed)token2.start);
      *(FT_Fixed *)((long)pvVar4 + uVar19) = FVar13;
      FVar13 = FT_RoundFix((FT_Fixed)token2.limit);
      *(FT_Fixed *)((long)pvVar4 + uVar19 + 8) = FVar13;
      FVar13 = FT_RoundFix(CONCAT44(token2._20_4_,token2.type));
      *(FT_Fixed *)((long)pvVar4 + uVar19 + 0x10) = FVar13;
      FVar13 = FT_RoundFix(local_50);
      *(FT_Fixed *)((long)pvVar4 + uVar19 + 0x18) = FVar13;
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field( PS_Parser       parser,
                        const T1_Field  field,
                        void**          objects,
                        FT_UInt         max_objects,
                        FT_ULong*       pflags )
  {
    T1_TokenRec   token;
    FT_Byte*      cur;
    FT_Byte*      limit;
    FT_UInt       count;
    FT_UInt       idx;
    FT_Error      error;
    T1_FieldType  type;


    /* this also skips leading whitespace */
    ps_parser_to_token( parser, &token );
    if ( !token.type )
      goto Fail;

    count = 1;
    idx   = 0;
    cur   = token.start;
    limit = token.limit;

    type = field->type;

    /* we must detect arrays in /FontBBox */
    if ( type == T1_FIELD_TYPE_BBOX )
    {
      T1_TokenRec  token2;
      FT_Byte*     old_cur   = parser->cursor;
      FT_Byte*     old_limit = parser->limit;


      /* don't include delimiters */
      parser->cursor = token.start + 1;
      parser->limit  = token.limit - 1;

      ps_parser_to_token( parser, &token2 );
      parser->cursor = old_cur;
      parser->limit  = old_limit;

      if ( token2.type == T1_TOKEN_TYPE_ARRAY )
      {
        type = T1_FIELD_TYPE_MM_BBOX;
        goto FieldArray;
      }
    }
    else if ( token.type == T1_TOKEN_TYPE_ARRAY )
    {
      count = max_objects;

    FieldArray:
      /* if this is an array and we have no blend, an error occurs */
      if ( max_objects == 0 )
        goto Fail;

      idx = 1;

      /* don't include delimiters */
      cur++;
      limit--;
    }

    for ( ; count > 0; count--, idx++ )
    {
      FT_Byte*    q      = (FT_Byte*)objects[idx] + field->offset;
      FT_Long     val;


      skip_spaces( &cur, limit );

      switch ( type )
      {
      case T1_FIELD_TYPE_BOOL:
        val = ps_tobool( &cur, limit );
        FT_TRACE4(( " %s", val ? "true" : "false" ));
        goto Store_Integer;

      case T1_FIELD_TYPE_FIXED:
        val = PS_Conv_ToFixed( &cur, limit, 0 );
        FT_TRACE4(( " %f", (double)val / 65536 ));
        goto Store_Integer;

      case T1_FIELD_TYPE_FIXED_1000:
        val = PS_Conv_ToFixed( &cur, limit, 3 );
        FT_TRACE4(( " %f", (double)val / 65536 / 1000 ));
        goto Store_Integer;

      case T1_FIELD_TYPE_INTEGER:
        val = PS_Conv_ToInt( &cur, limit );
        FT_TRACE4(( " %ld", val ));
        /* fall through */

      Store_Integer:
        switch ( field->size )
        {
        case (8 / FT_CHAR_BIT):
          *(FT_Byte*)q = (FT_Byte)val;
          break;

        case (16 / FT_CHAR_BIT):
          *(FT_UShort*)q = (FT_UShort)val;
          break;

        case (32 / FT_CHAR_BIT):
          *(FT_UInt32*)q = (FT_UInt32)val;
          break;

        default:                /* for 64-bit systems */
          *(FT_Long*)q = val;
        }
        break;

      case T1_FIELD_TYPE_STRING:
      case T1_FIELD_TYPE_KEY:
        {
          FT_Memory   memory = parser->memory;
          FT_UInt     len    = (FT_UInt)( limit - cur );
          FT_String*  string = NULL;


          if ( cur >= limit )
            break;

          /* we allow both a string or a name   */
          /* for cases like /FontName (foo) def */
          if ( token.type == T1_TOKEN_TYPE_KEY )
          {
            /* don't include leading `/' */
            len--;
            cur++;
          }
          else if ( token.type == T1_TOKEN_TYPE_STRING )
          {
            /* don't include delimiting parentheses    */
            /* XXX we don't handle <<...>> here        */
            /* XXX should we convert octal escapes?    */
            /*     if so, what encoding should we use? */
            cur++;
            len -= 2;
          }
          else
          {
            FT_ERROR(( "ps_parser_load_field:"
                       " expected a name or string\n" ));
            FT_ERROR(( "                     "
                       " but found token of type %d instead\n",
                       token.type ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          /* for this to work (FT_String**)q must have been */
          /* initialized to NULL                            */
          if ( *(FT_String**)q )
          {
            FT_TRACE0(( "ps_parser_load_field: overwriting field %s\n",
                        field->ident ));
            FT_FREE( *(FT_String**)q );
          }

          if ( FT_QALLOC( string, len + 1 ) )
            goto Exit;

          FT_MEM_COPY( string, cur, len );
          string[len] = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( token.type == T1_TOKEN_TYPE_STRING )
            FT_TRACE4(( " (%s)", string ));
          else
            FT_TRACE4(( " /%s", string ));
#endif

          *(FT_String**)q = string;
        }
        break;

      case T1_FIELD_TYPE_BBOX:
        {
          FT_Fixed  temp[4];
          FT_BBox*  bbox = (FT_BBox*)q;
          FT_Int    result;


          result = ps_tofixedarray( &cur, limit, 4, temp, 0 );

          if ( result < 4 )
          {
            FT_ERROR(( "ps_parser_load_field:"
                       " expected four integers in bounding box\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          bbox->xMin = FT_RoundFix( temp[0] );
          bbox->yMin = FT_RoundFix( temp[1] );
          bbox->xMax = FT_RoundFix( temp[2] );
          bbox->yMax = FT_RoundFix( temp[3] );

          FT_TRACE4(( " [%ld %ld %ld %ld]",
                      bbox->xMin / 65536,
                      bbox->yMin / 65536,
                      bbox->xMax / 65536,
                      bbox->yMax / 65536 ));
        }
        break;

      case T1_FIELD_TYPE_MM_BBOX:
        {
          FT_Memory  memory = parser->memory;
          FT_Fixed*  temp   = NULL;
          FT_Int     result;
          FT_UInt    i;


          if ( FT_QNEW_ARRAY( temp, max_objects * 4 ) )
            goto Exit;

          for ( i = 0; i < 4; i++ )
          {
            result = ps_tofixedarray( &cur, limit, (FT_Int)max_objects,
                                      temp + i * max_objects, 0 );
            if ( result < 0 || (FT_UInt)result < max_objects )
            {
              FT_ERROR(( "ps_parser_load_field:"
                         " expected %d integer%s in the %s subarray\n",
                         max_objects, max_objects > 1 ? "s" : "",
                         i == 0 ? "first"
                                : ( i == 1 ? "second"
                                           : ( i == 2 ? "third"
                                                      : "fourth" ) ) ));
              FT_ERROR(( "                     "
                         " of /FontBBox in the /Blend dictionary\n" ));
              error = FT_THROW( Invalid_File_Format );

              FT_FREE( temp );
              goto Exit;
            }

            skip_spaces( &cur, limit );
          }

          FT_TRACE4(( " [" ));
          for ( i = 0; i < max_objects; i++ )
          {
            FT_BBox*  bbox = (FT_BBox*)objects[i];


            bbox->xMin = FT_RoundFix( temp[i                  ] );
            bbox->yMin = FT_RoundFix( temp[i +     max_objects] );
            bbox->xMax = FT_RoundFix( temp[i + 2 * max_objects] );
            bbox->yMax = FT_RoundFix( temp[i + 3 * max_objects] );

            FT_TRACE4(( " [%ld %ld %ld %ld]",
                        bbox->xMin / 65536,
                        bbox->yMin / 65536,
                        bbox->xMax / 65536,
                        bbox->yMax / 65536 ));
          }
          FT_TRACE4(( "]" ));

          FT_FREE( temp );
        }
        break;

      default:
        /* an error occurred */
        goto Fail;
      }
    }

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    error = FT_Err_Ok;

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }